

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroups.cpp
# Opt level: O1

optional_idx duckdb::anon_unknown_280::ReadMemoryLimit(FileSystem *fs,string *file_path)

{
  char *__s;
  bool bVar1;
  int iVar2;
  uint uVar3;
  type pFVar4;
  undefined4 extraout_var;
  size_t sVar5;
  undefined1 strict;
  _func_int **pp_Var6;
  string_t input;
  string_t contents;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> handle;
  idx_t value;
  char buffer [100];
  undefined4 uStack_ac;
  undefined8 uStack_a8;
  optional_idx local_a0;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_98;
  idx_t local_90;
  undefined4 local_88 [28];
  
  iVar2 = (*fs->_vptr_FileSystem[0x12])(fs,file_path,0);
  if ((char)iVar2 == '\0') {
    local_a0.index = 0xffffffffffffffff;
  }
  else {
    (*fs->_vptr_FileSystem[2])(&local_98,fs,file_path,1,0x100,0);
    pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                        *)&local_98);
    pp_Var6 = fs->_vptr_FileSystem;
    iVar2 = (*pp_Var6[5])(fs,pFVar4,local_88);
    strict = SUB81(pp_Var6,0);
    *(undefined1 *)((long)local_88 + CONCAT44(extraout_var,iVar2)) = 0;
    __s = (char *)local_88;
    sVar5 = strlen(__s);
    uVar3 = (uint)sVar5;
    if (uVar3 < 0xd) {
      uStack_a8._4_4_ = 0;
      uStack_ac = 0;
      uStack_a8._0_4_ = 0;
      __s = (char *)0x0;
      if (uVar3 != 0) {
        switchD_012dd528::default(&uStack_ac,local_88,(ulong)(uVar3 & 0xf));
        __s = (char *)CONCAT44(uStack_a8._4_4_,(undefined4)uStack_a8);
      }
    }
    else {
      uStack_ac = local_88[0];
    }
    input.value.pointer.ptr = (char *)&local_90;
    input.value._0_8_ = __s;
    uStack_a8 = __s;
    bVar1 = TryCast::Operation<duckdb::string_t,unsigned_long>
                      ((TryCast *)CONCAT44(uStack_ac,uVar3),input,(uint64_t *)0x0,(bool)strict);
    if (bVar1) {
      optional_idx::optional_idx(&local_a0,local_90);
    }
    else {
      local_a0.index = 0xffffffffffffffff;
    }
    if (local_98._M_head_impl != (FileHandle *)0x0) {
      (*(local_98._M_head_impl)->_vptr_FileHandle[1])();
    }
  }
  return (optional_idx)local_a0.index;
}

Assistant:

static optional_idx ReadMemoryLimit(FileSystem &fs, const string &file_path) {
	if (!fs.FileExists(file_path)) {
		return optional_idx();
	}

	auto handle = fs.OpenFile(file_path, FileFlags::FILE_FLAGS_READ);
	char buffer[100];
	auto bytes_read = fs.Read(*handle, buffer, 99);
	buffer[bytes_read] = '\0';

	auto contents = string_t(buffer);
	idx_t value;
	if (TryCast::Operation<string_t, idx_t>(contents, value)) {
		return optional_idx(value);
	}
	return optional_idx();
}